

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurface::GetBBox(ON_OffsetSurface *this,double *bbox_min,double *bbox_max,bool bGrowBox)

{
  bool bVar1;
  int iVar2;
  ON_OffsetSurfaceValue *pOVar3;
  int local_3c;
  int count;
  int i;
  double distance;
  double d;
  bool rc;
  bool bGrowBox_local;
  double *bbox_max_local;
  double *bbox_min_local;
  ON_OffsetSurface *this_local;
  
  bVar1 = ON_SurfaceProxy::GetBBox(&this->super_ON_SurfaceProxy,bbox_min,bbox_max,false);
  if (bVar1) {
    _count = 0.0;
    iVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&(this->m_offset_function).m_offset_value);
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      pOVar3 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[]
                         (&(this->m_offset_function).m_offset_value,local_3c);
      if (_count < ABS(pOVar3->m_distance)) {
        _count = ABS(pOVar3->m_distance);
      }
    }
    _count = _count * 2.0;
    if (bbox_min != (double *)0x0) {
      *bbox_min = *bbox_min - _count;
      bbox_min[1] = bbox_min[1] - _count;
      bbox_min[2] = bbox_min[2] - _count;
    }
    if (bbox_max != (double *)0x0) {
      *bbox_max = _count + *bbox_max;
      bbox_max[1] = _count + bbox_max[1];
      bbox_max[2] = _count + bbox_max[2];
    }
  }
  return bVar1;
}

Assistant:

bool ON_OffsetSurface::GetBBox(
       double* bbox_min,
       double* bbox_max,
       bool bGrowBox
       ) const
{
  bool rc = ON_SurfaceProxy::GetBBox(bbox_min,bbox_max);
  if ( rc )
  {
    double d, distance = 0.0;
    int i, count = m_offset_function.m_offset_value.Count();
    for ( i = 0; i < count; i++ )
    {
      d = fabs(m_offset_function.m_offset_value[i].m_distance);
      if ( distance < d)
        distance = d;
    }
    distance *= 2;
    if ( 0 != bbox_min )
    {
      bbox_min[0] -= distance;
      bbox_min[1] -= distance;
      bbox_min[2] -= distance;
    }
    if ( 0 != bbox_max )
    {
      bbox_max[0] += distance;
      bbox_max[1] += distance;
      bbox_max[2] += distance;
    }
  }
  return rc;
}